

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_iterator_advance(void **param_1)

{
  _Bool _Var1;
  undefined1 uVar2;
  roaring64_bitmap_t *r_00;
  roaring64_iterator_t *it_00;
  char *file;
  roaring64_iterator_t *it;
  size_t i;
  uint64_t v;
  uint64_t i_1;
  roaring64_bulk_context_t context;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  roaring64_bitmap_t *r;
  int in_stack_ffffffffffffff5c;
  roaring64_bitmap_t *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  uint64_t in_stack_ffffffffffffff80;
  roaring64_bulk_context_t *in_stack_ffffffffffffff88;
  roaring64_bitmap_t *r_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  ulong local_50;
  undefined1 local_48 [32];
  
  r_00 = roaring64_bitmap_create();
  r_01 = (roaring64_bitmap_t *)&stack0xffffffffffffffd8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x108b7e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)r_01,
             (size_type)in_stack_ffffffffffffff88);
  memset(local_48,0,0x10);
  for (local_50 = 0; local_50 < 1000; local_50 = local_50 + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_ffffffffffffff70,
               (value_type *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    roaring64_bitmap_add_bulk(r_01,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  }
  local_60 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  it_00 = roaring64_iterator_create(in_stack_ffffffffffffff60);
  this = local_60;
  do {
    local_60 = this;
    roaring64_iterator_value(it_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffd8,
               (size_type)local_60);
    _assert_int_equal((unsigned_long)in_stack_ffffffffffffff70,
                      CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                      (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           ((long)&(local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start + 1);
    _Var1 = roaring64_iterator_advance
                      ((roaring64_iterator_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  } while (_Var1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffd8);
  _assert_int_equal((unsigned_long)this,
                    CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                    (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  uVar2 = roaring64_iterator_previous
                    ((roaring64_iterator_t *)
                     CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  _assert_true((unsigned_long)this,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff68),
               (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  file = (char *)roaring64_iterator_value(it_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffd8,
             (size_type)local_60);
  _assert_int_equal((unsigned_long)this,CONCAT17(uVar2,in_stack_ffffffffffffff68),file,
                    in_stack_ffffffffffffff5c);
  _Var1 = roaring64_iterator_advance
                    ((roaring64_iterator_t *)CONCAT17(uVar2,in_stack_ffffffffffffff68));
  _assert_true((unsigned_long)this,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff68),file,
               CONCAT13(_Var1,(int3)in_stack_ffffffffffffff5c));
  roaring64_iterator_free((roaring64_iterator_t *)0x108da6);
  roaring64_bitmap_free(r_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this);
  return;
}

Assistant:

DEFINE_TEST(test_iterator_advance) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    std::vector<uint64_t> values;
    values.reserve(1000);
    roaring64_bulk_context_t context{};
    for (uint64_t i = 0; i < 1000; ++i) {
        uint64_t v = i * 10000;
        values.push_back(v);
        roaring64_bitmap_add_bulk(r, &context, v);
    }
    size_t i = 0;
    roaring64_iterator_t* it = roaring64_iterator_create(r);
    do {
        assert_int_equal(roaring64_iterator_value(it), values[i]);
        i++;
    } while (roaring64_iterator_advance(it));
    assert_int_equal(i, values.size());

    // Check that we can move backward from after the last entry.
    assert_true(roaring64_iterator_previous(it));
    i--;
    assert_int_equal(roaring64_iterator_value(it), values[i]);

    // Check that we can't move forward again.
    assert_false(roaring64_iterator_advance(it));

    roaring64_iterator_free(it);
    roaring64_bitmap_free(r);
}